

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStream::getReadBuffer(BufferedInputStream *this)

{
  ArrayPtr<const_unsigned_char> AVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  uchar *extraout_RDX;
  Fault local_68;
  Fault f;
  size_t local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  BufferedInputStream *this_local;
  ArrayPtr<const_unsigned_char> result;
  
  _kjCondition._32_8_ = this;
  iVar3 = (*(this->super_InputStream)._vptr_InputStream[4])();
  this_local = (BufferedInputStream *)CONCAT44(extraout_var,iVar3);
  result.ptr = extraout_RDX;
  local_58 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  local_50 = _::DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_58)
  ;
  f.exception._4_4_ = 0;
  _::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_48,&local_50,
             (int *)((long)&f.exception + 4));
  bVar2 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar2) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[14]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x75,FAILED,"result.size() > 0","_kjCondition,\"Premature EOF\"",
               (DebugComparison<unsigned_long,_int> *)local_48,(char (*) [14])"Premature EOF");
    _::Debug::Fault::fatal(&local_68);
  }
  AVar1.size_ = (size_t)result.ptr;
  AVar1.ptr = (uchar *)this_local;
  return AVar1;
}

Assistant:

ArrayPtr<const byte> BufferedInputStream::getReadBuffer() {
  auto result = tryGetReadBuffer();
  KJ_REQUIRE(result.size() > 0, "Premature EOF");
  return result;
}